

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O3

double __thiscall iir_filter<6>::operator()(iir_filter<6> *this,double in)

{
  double *pdVar1;
  double *pdVar2;
  array<double,_7UL> *paVar3;
  double dVar4;
  double yvn;
  double local_18;
  double local_10;
  
  local_10 = in;
  boost::circular_buffer<double,std::allocator<double>>::push_front_impl<double_const&>
            (&this->xv_m,&local_10);
  pdVar1 = (this->xv_m).m_first;
  local_18 = 0.0;
  dVar4 = 0.0;
  if (pdVar1 != (double *)0x0 && (this->xv_m).m_size != 0) {
    paVar3 = &this->b_m;
    do {
      dVar4 = *pdVar1 * paVar3->_M_elems[0] + dVar4;
      pdVar1 = pdVar1 + 1;
      if (pdVar1 == (this->xv_m).m_end) {
        pdVar1 = (this->xv_m).m_buff;
      }
    } while ((pdVar1 != (this->xv_m).m_last) &&
            (paVar3 = (array<double,_7UL> *)(paVar3->_M_elems + 1), pdVar1 != (double *)0x0));
  }
  pdVar1 = (this->yv_m).m_first;
  if (pdVar1 != (double *)0x0 && (this->yv_m).m_size != 0) {
    pdVar2 = (this->a_m)._M_elems;
    local_18 = 0.0;
    do {
      pdVar2 = pdVar2 + 1;
      local_18 = *pdVar1 * *pdVar2 + local_18;
      pdVar1 = pdVar1 + 1;
      if (pdVar1 == (this->yv_m).m_end) {
        pdVar1 = (this->yv_m).m_buff;
      }
    } while ((pdVar1 != (this->yv_m).m_last) && (pdVar1 != (double *)0x0));
  }
  local_18 = this->gain_m * dVar4 - local_18;
  boost::circular_buffer<double,std::allocator<double>>::push_front_impl<double_const&>
            (&this->yv_m,&local_18);
  return local_18;
}

Assistant:

double operator()(double in)
    {
        xv_m.push_front(in);
        double yvn =
            gain_m * std::inner_product(xv_m.begin(), xv_m.end(), b_m.begin(), 0.0) -
            std::inner_product(yv_m.begin(), yv_m.end(), a_m.begin() + 1, 0.0);
        yv_m.push_front(yvn);
        return yvn;
    }